

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O2

bool test_DiceRoller_getDiceRolled(void)

{
  DiceRoller *this;
  int x;
  int iVar1;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  this = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this);
  for (iVar1 = 0; iVar1 != 10; iVar1 = iVar1 + 1) {
    DiceRoller::roll((vector<int,_std::allocator<int>_> *)&local_30,this,iVar1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  }
  iVar1 = *this->diceRolled;
  DiceRoller::~DiceRoller(this);
  operator_delete(this,0x10);
  return iVar1 == 0x2d;
}

Assistant:

bool test_DiceRoller_getDiceRolled() {
    auto* roller = new DiceRoller();

    int rolls = 0;
    for (int x = 0; x < 10; x++) {
        rolls += x;
        roller->roll(x);
    }

    bool success = roller->getDiceRolled() == rolls;
    delete (roller);

    return success;
}